

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O1

double Cudd_zddCountDouble(DdManager *zdd,DdNode *P)

{
  DdNode *base;
  DdNode *empty;
  st__table *table;
  double dVar1;
  
  base = zdd->one;
  empty = zdd->zero;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    dVar1 = -1.0;
  }
  else {
    dVar1 = cuddZddCountDoubleStep(P,table,base,empty);
    if ((dVar1 == -1.0) && (!NAN(dVar1))) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table,st__zdd_count_dbl_free,(char *)0x0);
    st__free_table(table);
  }
  return dVar1;
}

Assistant:

double
Cudd_zddCountDouble(
  DdManager * zdd,
  DdNode * P)
{
    st__table    *table;
    double      res;
    DdNode      *base, *empty;

    base  = DD_ONE(zdd);
    empty = DD_ZERO(zdd);
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return((double)CUDD_OUT_OF_MEM);
    res = cuddZddCountDoubleStep(P, table, base, empty);
    if (res == (double)CUDD_OUT_OF_MEM) {
        zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table, st__zdd_count_dbl_free, NIL(char));
    st__free_table(table);

    return(res);

}